

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O3

uint32_t __thiscall
cppnet::BufferBlock::_Read(BufferBlock *this,char *res,uint32_t len,bool move_pt)

{
  char *__src;
  char *pcVar1;
  ulong uVar2;
  ulong __n;
  ulong uVar3;
  size_t sVar4;
  
  __src = this->_read;
  pcVar1 = this->_write;
  if (__src < pcVar1) {
    uVar3 = (long)pcVar1 - (long)__src;
    uVar2 = (ulong)len;
    if (uVar3 <= uVar2) {
      memcpy(res,__src,uVar3);
      if (move_pt) {
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[4])(this);
      }
      uVar3 = uVar3 & 0xffffffff;
      goto LAB_00116250;
    }
    memcpy(res,__src,uVar2);
    if (move_pt) {
      this->_read = this->_read + uVar2;
    }
  }
  else {
    if ((__src == pcVar1) && (uVar3 = 0, this->_can_read == false)) goto LAB_00116250;
    sVar4 = (long)pcVar1 - (long)this->_buffer_start;
    __n = (long)this->_buffer_end - (long)__src;
    uVar3 = sVar4 + __n;
    uVar2 = (ulong)len;
    if (uVar3 <= uVar2) {
      memcpy(res,__src,__n);
      memcpy(res + __n,this->_buffer_start,sVar4);
      if (move_pt) {
        (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[4])(this);
      }
      goto LAB_00116250;
    }
    sVar4 = uVar2 - __n;
    if (uVar2 < __n || sVar4 == 0) {
      memcpy(res,__src,uVar2);
      if (move_pt) {
        this->_read = this->_read + uVar2;
      }
    }
    else {
      memcpy(res,__src,__n);
      memcpy(res + __n,this->_buffer_start,sVar4);
      if (move_pt) {
        this->_read = this->_buffer_start + sVar4;
      }
    }
  }
  uVar3 = (ulong)len;
LAB_00116250:
  return (uint32_t)uVar3;
}

Assistant:

uint32_t BufferBlock::_Read(char* res, uint32_t len, bool move_pt) {
    /*s-----------r-----w-------------e*/
    if (_read < _write) {
        size_t size = _write - _read;
        // res can load all
        if (size <= len) {
            memcpy(res, _read, size);
            if(move_pt) {
                Clear();
            }
            return (uint32_t)size;

        // only read len
        } else {
            memcpy(res, _read, len);
            if(move_pt) {
                _read += len;
            }
            return len;
        }

    /*s-----------w-----r-------------e*/
    /*s----------------wr-------------e*/
    } else {
        if(!_can_read && _read == _write) {
            return 0;
        }
        size_t size_start = _write - _buffer_start;
        size_t size_end = _buffer_end - _read;
        size_t size =  size_start + size_end;
        // res can load all
        if (size <= len) {
            memcpy(res, _read, size_end);
            memcpy(res + size_end, _buffer_start, size_start);
            if(move_pt) {
                // reset point
                Clear();
            }
            return (uint32_t)size;

        } else {
            if (len <= size_end) {
                memcpy(res, _read, len);
                if(move_pt) {
                    _read += len;
                }
                return len;

            } else {
                size_t left = len - size_end;
                memcpy(res, _read, size_end);
                memcpy(res + size_end, _buffer_start, left);
                if(move_pt) {
                    _read = _buffer_start + left;
                }
                return len;
            }
        }
    }
}